

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O2

Builder * embree::sse2::BVH4BuilderTwoLevelVirtualSAH(void *bvh,Scene *scene,bool useMortonBuilder)

{
  BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> *this;
  
  this = (BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object> *)::operator_new(0xa8);
  BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object>::BVHNBuilderTwoLevel
            (this,(BVH *)bvh,scene,MTY_USER_GEOMETRY,useMortonBuilder,0x400);
  return (Builder *)this;
}

Assistant:

Builder* BVH4BuilderTwoLevelVirtualSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
    return new BVHNBuilderTwoLevel<4,UserGeometry,Object>((BVH4*)bvh,scene,UserGeometry::geom_type,useMortonBuilder);
    }